

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

void __thiscall QMdiSubWindowPrivate::setMaximizeMode(QMdiSubWindowPrivate *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  QMdiSubWindow *mdiChild;
  Data *pDVar5;
  QWidgetData *pQVar6;
  QObject *pQVar7;
  undefined1 auVar8 [12];
  Representation RVar9;
  bool bVar10;
  int iVar11;
  QWidget *pQVar12;
  Data *pDVar13;
  QMenuBar *menuBar;
  QAbstractScrollArea *this_00;
  QWidget *pQVar14;
  QScrollBar *this_01;
  QScrollBar *this_02;
  ControlContainer *this_03;
  short sVar15;
  Representation RVar16;
  int iVar17;
  int iVar18;
  Representation RVar19;
  long in_FS_OFFSET;
  QSize QVar20;
  QRect QVar21;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  mdiChild = *(QMdiSubWindow **)&(this->super_QWidgetPrivate).field_0x8;
  ensureWindowState(this,WindowMaximized);
  this->isShadeMode = false;
  this->isMaximizeMode = true;
  pQVar12 = QApplication::focusWidget();
  if (((pQVar12 != (QWidget *)0x0) &&
      (((pDVar5 = (this->restoreFocusWidget).wp.d, pDVar5 == (Data *)0x0 ||
        (*(int *)(pDVar5 + 4) == 0)) || ((this->restoreFocusWidget).wp.value == (QObject *)0x0))))
     && (bVar10 = QWidget::isAncestorOf
                            (*(QWidget **)&(this->super_QWidgetPrivate).field_0x8,pQVar12), bVar10))
  {
    pDVar13 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(&pQVar12->super_QObject);
    pDVar5 = (this->restoreFocusWidget).wp.d;
    (this->restoreFocusWidget).wp.d = pDVar13;
    (this->restoreFocusWidget).wp.value = &pQVar12->super_QObject;
    if (pDVar5 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar5 = *(int *)pDVar5 + -1;
      UNLOCK();
      if (*(int *)pDVar5 == 0) {
        operator_delete(pDVar5);
      }
    }
  }
  setSizeGripVisible(this,false);
  if (((this->restoreSize).wd.m_i < 0) || ((this->restoreSize).ht.m_i < 0)) {
    pQVar6 = (mdiChild->super_QWidget).data;
    RVar16.m_i = (pQVar6->crect).y1.m_i;
    RVar19.m_i = (pQVar6->crect).x2.m_i;
    RVar9.m_i = (pQVar6->crect).y2.m_i;
    (this->oldGeometry).x1 = (Representation)(pQVar6->crect).x1.m_i;
    (this->oldGeometry).y1 = (Representation)RVar16.m_i;
    (this->oldGeometry).x2 = (Representation)RVar19.m_i;
    (this->oldGeometry).y2 = (Representation)RVar9.m_i;
    uVar1 = (this->oldGeometry).x2;
    uVar3 = (this->oldGeometry).y2;
    uVar2 = (this->oldGeometry).x1;
    uVar4 = (this->oldGeometry).y1;
    QVar20.wd.m_i = (uVar1 - uVar2) + 1;
    QVar20.ht.m_i = (uVar3 - uVar4) + 1;
    this->restoreSize = QVar20;
  }
  sVar15 = (short)((mdiChild->super_QWidget).data)->widget_attributes;
  if (sVar15 < 0) {
    (**(code **)(*(long *)&mdiChild->super_QWidget + 0x68))(mdiChild,0);
  }
  pDVar5 = (this->baseWidget).wp.d;
  if (((pDVar5 != (Data *)0x0) &&
      (pQVar12 = (QWidget *)(this->baseWidget).wp.value,
      pQVar12 != (QWidget *)0x0 && *(int *)(pDVar5 + 4) != 0)) && (this->isWidgetHiddenByUs == true)
     ) {
    QWidget::show(pQVar12);
    this->isWidgetHiddenByUs = false;
  }
  updateGeometryConstraints(this);
  if (sVar15 < 0) {
    menuBar = QMdiSubWindowPrivate::menuBar(this);
    if (menuBar == (QMenuBar *)0x0) {
      pDVar5 = (this->controlContainer).wp.d;
      if (((pDVar5 == (Data *)0x0) || (*(int *)(pDVar5 + 4) == 0)) ||
         ((this->controlContainer).wp.value == (QObject *)0x0)) {
        this_03 = (ControlContainer *)operator_new(0x70);
        QMdi::ControlContainer::ControlContainer(this_03,mdiChild);
        pDVar13 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)this_03);
        pDVar5 = (this->controlContainer).wp.d;
        (this->controlContainer).wp.d = pDVar13;
        (this->controlContainer).wp.value = (QObject *)this_03;
        if (pDVar5 != (Data *)0x0) {
          LOCK();
          *(int *)pDVar5 = *(int *)pDVar5 + -1;
          UNLOCK();
          if (*(int *)pDVar5 == 0) {
            operator_delete(pDVar5);
          }
        }
      }
    }
    else {
      showButtonsInMenuBar(this,menuBar);
    }
  }
  pQVar12 = *(QWidget **)(*(long *)&(mdiChild->super_QWidget).field_0x8 + 0x10);
  QVar21 = QWidget::contentsRect(pQVar12);
  auVar8 = QVar21._0_12_;
  local_48._0_8_ = QVar21._0_8_;
  this_00 = (QAbstractScrollArea *)
            QMetaObject::cast((QObject *)&QAbstractScrollArea::staticMetaObject);
  RVar19 = QVar21.y1.m_i;
  RVar16 = QVar21.y2.m_i;
  if ((this_00 != (QAbstractScrollArea *)0x0) &&
     (pQVar14 = QAbstractScrollArea::viewport(this_00), pQVar14 == pQVar12)) {
    this_01 = QAbstractScrollArea::horizontalScrollBar(this_00);
    this_02 = QAbstractScrollArea::verticalScrollBar(this_00);
    iVar18 = 0;
    iVar11 = 0;
    if (this_01 != (QScrollBar *)0x0) {
      iVar11 = QAbstractSlider::value(&this_01->super_QAbstractSlider);
    }
    if (this_02 != (QScrollBar *)0x0) {
      iVar18 = QAbstractSlider::value(&this_02->super_QAbstractSlider);
    }
    local_48.x1.m_i = QVar21.x1.m_i.m_i - iVar11;
    auVar8._4_4_ = 0;
    auVar8._0_4_ = local_48.x1.m_i;
    RVar19.m_i = RVar19.m_i - iVar18;
    local_48.y1.m_i = RVar19.m_i;
    auVar8._8_4_ = QVar21.x2.m_i.m_i - iVar11;
    RVar16.m_i = RVar16.m_i - iVar18;
    (this->oldGeometry).x1.m_i = iVar11 + (this->oldGeometry).x1.m_i;
    (this->oldGeometry).y1.m_i = iVar18 + (this->oldGeometry).y1.m_i;
    (this->oldGeometry).x2.m_i = iVar11 + (this->oldGeometry).x2.m_i;
    (this->oldGeometry).y2.m_i = iVar18 + (this->oldGeometry).y2.m_i;
  }
  iVar18 = (auVar8._8_4_ - auVar8._0_4_) + 1;
  iVar17 = (RVar16.m_i - RVar19.m_i) + 1;
  iVar11 = (this->internalMinimumSize).wd.m_i;
  if (iVar18 <= iVar11) {
    iVar18 = iVar11;
  }
  iVar11 = (this->internalMinimumSize).ht.m_i;
  if (iVar17 <= iVar11) {
    iVar17 = iVar11;
  }
  local_48.x2.m_i = auVar8._0_4_ + -1 + iVar18;
  local_48.y2.m_i = RVar19.m_i + iVar17 + -1;
  if (this->isInRubberBandMode == true) {
    QRubberBand::setGeometry(this->rubberBand,&local_48);
  }
  else {
    QWidget::setGeometry(*(QWidget **)&(this->super_QWidgetPrivate).field_0x8,&local_48);
  }
  ensureWindowState(this,WindowMaximized);
  if (sVar15 < 0) {
    (**(code **)(*(long *)&mdiChild->super_QWidget + 0x68))(mdiChild,1);
  }
  this->resizeEnabled = false;
  this->moveEnabled = false;
  pDVar5 = this->actions[1].wp.d;
  if (((pDVar5 != (Data *)0x0) && (*(int *)(pDVar5 + 4) != 0)) &&
     (pQVar7 = this->actions[1].wp.value, pQVar7 != (QObject *)0x0)) {
    QAction::setEnabled(SUB81(pQVar7,0));
  }
  pDVar5 = this->actions[4].wp.d;
  if (((pDVar5 != (Data *)0x0) && (*(int *)(pDVar5 + 4) != 0)) &&
     (pQVar7 = this->actions[4].wp.value, pQVar7 != (QObject *)0x0)) {
    QAction::setEnabled(SUB81(pQVar7,0));
  }
  pDVar5 = this->actions[3].wp.d;
  if (((pDVar5 != (Data *)0x0) && (*(int *)(pDVar5 + 4) != 0)) &&
     (pQVar7 = this->actions[3].wp.value, pQVar7 != (QObject *)0x0)) {
    QAction::setEnabled(SUB81(pQVar7,0));
  }
  pDVar5 = this->actions[0].wp.d;
  if (((pDVar5 != (Data *)0x0) && (*(int *)(pDVar5 + 4) != 0)) &&
     (pQVar7 = this->actions[0].wp.value, pQVar7 != (QObject *)0x0)) {
    QAction::setEnabled(SUB81(pQVar7,0));
  }
  pDVar5 = this->actions[2].wp.d;
  if (((pDVar5 != (Data *)0x0) && (*(int *)(pDVar5 + 4) != 0)) &&
     (pQVar7 = this->actions[2].wp.value, pQVar7 != (QObject *)0x0)) {
    QAction::setEnabled(SUB81(pQVar7,0));
  }
  restoreFocus(this);
  updateMask(this);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiSubWindowPrivate::setMaximizeMode()
{
    Q_Q(QMdiSubWindow);
    Q_ASSERT(parent);

    ensureWindowState(Qt::WindowMaximized);
    isShadeMode = false;
    isMaximizeMode = true;

    storeFocusWidget();

#if QT_CONFIG(sizegrip)
    setSizeGripVisible(false);
#endif

    // Store old geometry and set restore size if not already set.
    if (!restoreSize.isValid()) {
        oldGeometry = q->geometry();
        restoreSize.setWidth(oldGeometry.width());
        restoreSize.setHeight(oldGeometry.height());
    }

    // Hide the window before we change the geometry to avoid multiple resize
    // events and wrong window state.
    const bool wasVisible = q->isVisible();
    if (wasVisible)
        q->setVisible(false);

    // Show the internal widget if it was hidden by us.
    if (baseWidget && isWidgetHiddenByUs) {
        baseWidget->show();
        isWidgetHiddenByUs = false;
    }

    updateGeometryConstraints();

    if (wasVisible) {
#if QT_CONFIG(menubar)
        if (QMenuBar *mBar = menuBar())
            showButtonsInMenuBar(mBar);
        else
#endif
        if (!controlContainer)
            controlContainer = new ControlContainer(q);
    }

    QWidget *parent = q->parentWidget();
    QRect availableRect = parent->contentsRect();

    // Adjust geometry if the sub-window is inside a scroll area.
    QAbstractScrollArea *scrollArea = qobject_cast<QAbstractScrollArea *>(parent->parentWidget());
    if (scrollArea && scrollArea->viewport() == parent) {
        QScrollBar *hbar = scrollArea->horizontalScrollBar();
        QScrollBar *vbar = scrollArea->verticalScrollBar();
        const int xOffset = hbar ? hbar->value() : 0;
        const int yOffset = vbar ? vbar->value() : 0;
        availableRect.adjust(-xOffset, -yOffset, -xOffset, -yOffset);
        oldGeometry.adjust(xOffset, yOffset, xOffset, yOffset);
    }

    setNewGeometry(&availableRect);
    // QWidget::setGeometry will reset Qt::WindowMaximized so we have to update it here.
    ensureWindowState(Qt::WindowMaximized);

    if (wasVisible)
        q->setVisible(true);

    resizeEnabled = false;
    moveEnabled = false;

#ifndef QT_NO_ACTION
    setEnabled(MoveAction, moveEnabled);
    setEnabled(MaximizeAction, false);
    setEnabled(MinimizeAction, true);
    setEnabled(RestoreAction, true);
    setEnabled(ResizeAction, resizeEnabled);
#endif // QT_NO_ACTION

    Q_ASSERT(q->windowState() & Qt::WindowMaximized);
    Q_ASSERT(!(q->windowState() & Qt::WindowMinimized));

    restoreFocus();
    updateMask();
}